

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O2

void __thiscall slang::ast::UnrollVisitor::handle(UnrollVisitor *this,ConditionalStatement *stmt)

{
  bool bVar1;
  long lVar2;
  pointer pCVar3;
  anon_class_16_2_3fdda46f fallback;
  ConstantValue result;
  anon_class_16_2_3fdda46f local_68;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  local_68.stmt = stmt;
  local_68.this = this;
  if (this->setupMode == true) {
LAB_00782905:
    handle::anon_class_16_2_3fdda46f::operator()(&local_68);
  }
  else {
    pCVar3 = (stmt->conditions)._M_ptr;
    for (lVar2 = (stmt->conditions)._M_extent._M_extent_value << 4; lVar2 != 0;
        lVar2 = lVar2 + -0x10) {
      if ((pCVar3->pattern != (Pattern *)0x0) || (bVar1 = step(this), !bVar1)) goto LAB_00782905;
      Expression::eval((ConstantValue *)&local_58,(pCVar3->expr).ptr,&this->evalCtx);
      if (local_58._M_index == '\0') {
        handle::anon_class_16_2_3fdda46f::operator()(&local_68);
LAB_007829a2:
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage(&local_58);
        return;
      }
      bVar1 = ConstantValue::isTrue((ConstantValue *)&local_58);
      if (!bVar1) {
        if (stmt->ifFalse != (Statement *)0x0) {
          Statement::visit<slang::ast::UnrollVisitor&>(stmt->ifFalse,this);
        }
        goto LAB_007829a2;
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_58);
      pCVar3 = pCVar3 + 1;
    }
    Statement::visit<slang::ast::UnrollVisitor&>(stmt->ifTrue,this);
  }
  return;
}

Assistant:

void handle(const ConditionalStatement& stmt) {
        // Evaluate the condition; if not constant visit both sides,
        // otherwise visit only the side that matches the condition.
        auto fallback = [&] {
            stmt.ifTrue.visit(*this);
            if (stmt.ifFalse)
                stmt.ifFalse->visit(*this);
        };

        if (setupMode) {
            fallback();
            return;
        }

        for (auto& cond : stmt.conditions) {
            if (cond.pattern || !step()) {
                fallback();
                return;
            }

            auto result = cond.expr->eval(evalCtx);
            if (!result) {
                fallback();
                return;
            }

            if (!result.isTrue()) {
                if (stmt.ifFalse)
                    stmt.ifFalse->visit(*this);
                return;
            }
        }

        stmt.ifTrue.visit(*this);
    }